

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O2

size_type __thiscall wabt::string_view::find(string_view *this,char c,size_type pos)

{
  size_type sVar1;
  string_view s;
  char c_local;
  
  s.size_ = 1;
  s.data_ = &c_local;
  sVar1 = find(this,s,pos);
  return sVar1;
}

Assistant:

string_view::size_type string_view::find(char c, size_type pos) const noexcept {
  return find(string_view(&c, 1), pos);
}